

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  char *pcVar1;
  char cVar2;
  StrID SVar3;
  uint64_t uVar4;
  GCstr *pGVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  GCRef *pGVar9;
  uint8_t uVar10;
  StrHash hashc;
  int iVar11;
  GCstr *pGVar12;
  uint64_t uVar13;
  uint uVar14;
  GCstr *unaff_RBP;
  GCstr *pGVar15;
  uint uVar16;
  
  uVar4 = (L->glref).ptr64;
  if (lenx - 1 < 0x7ffffeff) {
    uVar16 = (uint)lenx;
    hashc = (*hash_sparse)(*(uint64_t *)(uVar4 + 0xb0),str,uVar16);
    pGVar5 = *(GCstr **)(*(long *)(uVar4 + 0x98) + (ulong)(hashc & *(uint *)(uVar4 + 0xa0)) * 8);
    uVar14 = 0;
    if (((ulong)pGVar5 & 1) == 0) {
      uVar10 = '\0';
      pGVar15 = pGVar5;
      uVar14 = 0;
    }
    else {
      hashc = (*hash_dense)(*(uint64_t *)(uVar4 + 0xb0),hashc,str,uVar16);
      uVar10 = '\x01';
      pGVar15 = (GCstr *)(*(ulong *)(*(long *)(uVar4 + 0x98) +
                                    (ulong)(hashc & *(uint *)(uVar4 + 0xa0)) * 8) &
                         0xfffffffffffffffe);
    }
    do {
      pGVar12 = pGVar15;
      if (pGVar12 == (GCstr *)0x0) {
        if ((0x20 < uVar14) && (((ulong)pGVar5 & 1) == 0)) {
          pGVar12 = lj_str_rehash_chain(L,hashc,str,uVar16);
          return pGVar12;
        }
        pGVar12 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,(ulong)(uVar16 & 0x7ffffffc) + 0x1c);
        uVar4 = (L->glref).ptr64;
        pGVar12->marked = *(byte *)(uVar4 + 0x20) & 3;
        pGVar12->gct = '\x04';
        pGVar12->len = uVar16;
        pGVar12->hash = hashc;
        pcVar1 = (char *)(uVar4 + 0xac);
        cVar2 = *pcVar1;
        *pcVar1 = *pcVar1 + -1;
        if (cVar2 == '\0') {
          uVar13 = lj_prng_u64((PRNGState *)(uVar4 + 0x188));
          *(int *)(uVar4 + 0xa8) = (int)uVar13;
          *(char *)(uVar4 + 0xac) = (char)(uVar13 >> 0x38);
        }
        SVar3 = *(StrID *)(uVar4 + 0xa8);
        *(StrID *)(uVar4 + 0xa8) = SVar3 + 1;
        pGVar12->sid = SVar3;
        pGVar12->reserved = '\0';
        pGVar12->hashalg = uVar10;
        *(undefined4 *)((long)&pGVar12[1].nextgc.gcptr64 + (ulong)(uVar16 & 0x7ffffffc)) = 0;
        memcpy(pGVar12 + 1,str,lenx);
        uVar14 = *(uint *)(uVar4 + 0xa0);
        lVar6 = *(long *)(uVar4 + 0x98);
        uVar7 = *(ulong *)(lVar6 + (ulong)(hashc & uVar14) * 8);
        (pGVar12->nextgc).gcptr64 = uVar7 & 0xfffffffffffffffe;
        *(ulong *)(lVar6 + (ulong)(hashc & uVar14) * 8) = (ulong)((uint)uVar7 & 1) | (ulong)pGVar12;
        uVar16 = *(uint *)(uVar4 + 0xa4);
        *(uint *)(uVar4 + 0xa4) = uVar16 + 1;
        if (uVar16 <= uVar14) {
          return pGVar12;
        }
        lj_str_resize(L,uVar14 * 2 + 1);
        return pGVar12;
      }
      if ((pGVar12->hash == hashc) && (pGVar12->len == uVar16)) {
        iVar11 = bcmp(str,pGVar12 + 1,lenx);
        if (iVar11 != 0) {
          uVar14 = uVar14 + 1;
          goto LAB_0010bf51;
        }
        if ((~*(byte *)(uVar4 + 0x20) & pGVar12->marked & 3) != 0) {
          pGVar12->marked = pGVar12->marked ^ 3;
        }
        bVar8 = false;
        pGVar15 = pGVar12;
      }
      else {
LAB_0010bf51:
        uVar14 = uVar14 + 1;
        pGVar9 = &pGVar12->nextgc;
        bVar8 = true;
        pGVar12 = unaff_RBP;
        pGVar15 = (GCstr *)pGVar9->gcptr64;
      }
      unaff_RBP = pGVar12;
    } while (bVar8);
  }
  else {
    if (lenx != 0) {
      lj_err_msg(L,LJ_ERR_STROV);
    }
    pGVar12 = (GCstr *)(uVar4 + 0x78);
  }
  return pGVar12;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g = G(L);
  if (lenx-1 < LJ_MAX_STR-1) {
    MSize len = (MSize)lenx;
    StrHash hash = hash_sparse(g->str.seed, str, len);
    MSize coll = 0;
    int hashalg = 0;
    /* Check if the string has already been interned. */
    GCobj *o = gcref(g->str.tab[hash & g->str.mask]);
#if LUAJIT_SECURITY_STRHASH
    if (LJ_UNLIKELY((uintptr_t)o & 1)) {  /* Secondary hash for this chain? */
      hashalg = 1;
      hash = hash_dense(g->str.seed, hash, str, len);
      o = (GCobj *)(gcrefu(g->str.tab[hash & g->str.mask]) & ~(uintptr_t)1);
    }
#endif
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == hash && sx->len == len) {
	if (memcmp(str, strdata(sx), len) == 0) {
	  if (isdead(g, o)) flipwhite(o);  /* Resurrect if dead. */
	  return sx;  /* Return existing string. */
	}
	coll++;
      }
      coll++;
      o = gcnext(o);
    }
#if LUAJIT_SECURITY_STRHASH
    /* Rehash chain if there are too many collisions. */
    if (LJ_UNLIKELY(coll > LJ_STR_MAXCOLL) && !hashalg) {
      return lj_str_rehash_chain(L, hash, str, len);
    }
#endif
    /* Otherwise allocate a new string. */
    return lj_str_alloc(L, str, len, hash, hashalg);
  } else {
    if (lenx)
      lj_err_msg(L, LJ_ERR_STROV);
    return &g->strempty;
  }
}